

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

vector_t ** alloc_gau_acc(uint32 n_stream,uint32 n_density,uint32 *veclen,uint32 blksize)

{
  int iVar1;
  vector_t **pppfVar2;
  void *pvVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  
  pppfVar2 = (vector_t **)
             __ckd_calloc_2d__(1,(ulong)n_stream,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                               ,0x3ec);
  pvVar3 = __ckd_calloc__((ulong)((int)veclen * n_stream),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x3ee);
  if (n_stream != 0) {
    iVar1 = *(int *)CONCAT44(in_register_00000034,n_density);
    uVar4 = 0;
    uVar5 = 0;
    do {
      (*pppfVar2)[uVar5] = (vector_t)((long)pvVar3 + (ulong)uVar4 * 4);
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + iVar1;
    } while (n_stream != uVar5);
  }
  return pppfVar2;
}

Assistant:

static vector_t **
alloc_gau_acc(uint32 n_stream,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 blksize)
{
    vector_t **param;
    float32 *buf;
    uint32 j, k, l;

    param = (vector_t **) ckd_calloc_2d(n_stream, n_density,
					sizeof(vector_t));
    
    buf = ckd_calloc(n_density * blksize, sizeof(float32));

    for (j = 0, l = 0; j < n_stream; j++) {
	for (k = 0; k < n_density; k++) {
	    param[j][k] = &buf[l];

	    l += veclen[j];
	}
    }

    return param;
}